

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void __thiscall
fill<64U,_15U,_buffer_layout_dfs>::operator()
          (fill<64U,_15U,_buffer_layout_dfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  unsigned_long *puVar1;
  uchar *puVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  unsigned_long uVar8;
  uchar *__s2;
  uchar **ppuVar9;
  unsigned_long uVar10;
  long lVar11;
  DI __d;
  size_t local_78;
  fill<64U,_30U,_buffer_layout_dfs> local_64;
  fill<64U,_31U,_buffer_layout_dfs> local_63;
  fill<64U,_31U,_buffer_layout_dfs> local_62;
  fill<64U,_30U,_buffer_layout_dfs> local_61;
  unsigned_long *local_60;
  uchar **local_58;
  size_t local_50;
  array<Stream,_64UL> *local_48;
  uchar **local_40;
  DI local_38;
  
  local_48 = streams;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"fill_inner",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", inner, I=",0xb);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 0x1e;
  local_60 = buffer_count->_M_elems + 0x1f;
  local_40 = buffer + 0x1360;
  local_58 = buffer + 0x1160;
  local_50 = 0;
  local_78 = 0;
  do {
    uVar8 = *puVar1;
    if (uVar8 == 0) {
      fill<64U,_30U,_buffer_layout_dfs>::operator()(&local_61,local_48,buffer,buffer_count);
      uVar8 = *puVar1;
      if (uVar8 == 0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        sVar4 = local_50;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"left stream drained\n",0x14);
        local_78 = -local_78;
        lVar11 = -sVar4;
        uVar8 = *local_60;
        goto LAB_001c1245;
      }
    }
    uVar10 = *local_60;
    if (uVar10 == 0) {
      fill<64U,_31U,_buffer_layout_dfs>::operator()(&local_62,local_48,buffer,buffer_count);
      uVar10 = *local_60;
      if (uVar10 == 0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        sVar4 = local_50;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"right stream drained\n",0x15);
        local_78 = -local_78;
        lVar11 = -sVar4;
        uVar8 = *puVar1;
        goto LAB_001c1344;
      }
      uVar8 = *puVar1;
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"L:\'",3);
    puVar2 = local_40[-uVar8 + 8];
    if (puVar2 == (uchar *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen((char *)puVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)puVar2,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\', R:\'",6);
    puVar2 = buffer[-uVar10 + 0x139e];
    if (puVar2 == (uchar *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen((char *)puVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)puVar2,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'\n",2);
    puVar2 = buffer[-uVar8 + 0x1368];
    if (puVar2 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2 = buffer[-uVar10 + 0x139e];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar5 = strcmp((char *)puVar2,(char *)__s2);
    puVar3 = local_60;
    if (iVar5 < 1) {
      __s2 = puVar2;
      puVar3 = puVar1;
    }
    *puVar3 = *puVar3 - 1;
    buffer[local_50 + 0x1160] = __s2;
    check_input(local_58,local_50);
    local_78 = local_78 + -8;
    local_50 = local_50 + 1;
  } while (local_50 != 0x200);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Done, buffer filled\n",0x14);
  buffer_count->_M_elems[0xf] = 0x200;
  goto LAB_001c14be;
LAB_001c1245:
  do {
    if (uVar8 == 0) {
      fill<64U,_31U,_buffer_layout_dfs>::operator()(&local_63,local_48,buffer,buffer_count);
      uVar8 = *local_60;
      if (uVar8 == 0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"both streams prematurely drained\n",0x21);
        ppuVar9 = (uchar **)((long)local_40 - local_78);
        memmove(local_40 + lVar11,local_58,local_78);
        buffer_count->_M_elems[0xf] = -lVar11;
        check_input(ppuVar9,-lVar11);
        goto LAB_001c14be;
      }
    }
    *(uchar **)((long)buffer + local_78 + 0x8b00) = buffer[0x139e - uVar8];
    uVar8 = uVar8 - 1;
    *local_60 = uVar8;
    lVar11 = lVar11 + -1;
    local_78 = local_78 + 8;
  } while (local_78 != 0x1000);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tbuffer filled\n",0xf);
  buffer_count->_M_elems[0xf] = 0x200;
  check_input(local_58,0x200);
  goto LAB_001c14be;
LAB_001c1344:
  do {
    if (uVar8 == 0) {
      fill<64U,_30U,_buffer_layout_dfs>::operator()(&local_64,local_48,buffer,buffer_count);
      uVar8 = *puVar1;
      if (uVar8 == 0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"both streams prematurely drained\n",0x21);
        ppuVar9 = (uchar **)((long)local_40 - local_78);
        memmove(local_40 + lVar11,local_58,local_78);
        buffer_count->_M_elems[0xf] = -lVar11;
        check_input(ppuVar9,-lVar11);
        goto LAB_001c14be;
      }
    }
    *(uchar **)((long)local_40 + (local_78 - 0x1000)) = local_40[8 - uVar8];
    uVar8 = uVar8 - 1;
    *puVar1 = uVar8;
    lVar11 = lVar11 + -1;
    local_78 = local_78 + 8;
  } while (local_78 != 0x1000);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"buffer filled\n",0xe);
  buffer_count->_M_elems[0xf] = 0x200;
  check_input(local_58,0x200);
LAB_001c14be:
  anon_func::DI::~DI(&local_38);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}